

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeModuleCreateEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t param_1,ze_device_handle_t param_2,
          ze_module_desc_t *param_3,ze_module_handle_t *param_4,
          ze_module_build_log_handle_t *param_5,ze_result_t result)

{
  allocator local_59;
  string local_58 [32];
  ze_module_build_log_handle_t *local_38;
  ze_module_build_log_handle_t *param_5_local;
  ze_module_handle_t *param_4_local;
  ze_module_desc_t *param_3_local;
  ze_device_handle_t param_2_local;
  ze_context_handle_t param_1_local;
  ZEbasic_leakChecker *this_local;
  
  if (result == ZE_RESULT_SUCCESS) {
    local_38 = param_5;
    param_5_local = (ze_module_build_log_handle_t *)param_4;
    param_4_local = (ze_module_handle_t *)param_3;
    param_3_local = (ze_module_desc_t *)param_2;
    param_2_local = (ze_device_handle_t)param_1;
    param_1_local = (ze_context_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"zeModuleCreate",&local_59);
    countFunctionCall(this,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return result;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeModuleCreateEpilogue(ze_context_handle_t, ze_device_handle_t, const ze_module_desc_t*, ze_module_handle_t*, ze_module_build_log_handle_t*, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeModuleCreate");
        }
        return result;
    }